

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O2

bool net_uv::net_compareAddress(sockaddr *addr1,sockaddr *addr2)

{
  sa_family_t sVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  
  if (addr2 != (sockaddr *)0x0 && addr1 != (sockaddr *)0x0) {
    if (addr1 == addr2) {
      return true;
    }
    sVar1 = addr1->sa_family;
    if (sVar1 == addr2->sa_family) {
      if (sVar1 == 2) {
        if (*(short *)addr1->sa_data != *(short *)addr2->sa_data) {
          return false;
        }
        bVar2 = *(int *)(addr1->sa_data + 2) == *(int *)(addr2->sa_data + 2);
      }
      else {
        if (sVar1 != 10) {
          return false;
        }
        if (*(short *)addr1->sa_data != *(short *)addr2->sa_data) {
          return false;
        }
        auVar3[0] = -(addr1->sa_data[6] == addr2->sa_data[6]);
        auVar3[1] = -(addr1->sa_data[7] == addr2->sa_data[7]);
        auVar3[2] = -(addr1->sa_data[8] == addr2->sa_data[8]);
        auVar3[3] = -(addr1->sa_data[9] == addr2->sa_data[9]);
        auVar3[4] = -(addr1->sa_data[10] == addr2->sa_data[10]);
        auVar3[5] = -(addr1->sa_data[0xb] == addr2->sa_data[0xb]);
        auVar3[6] = -(addr1->sa_data[0xc] == addr2->sa_data[0xc]);
        auVar3[7] = -(addr1->sa_data[0xd] == addr2->sa_data[0xd]);
        auVar3[8] = -((char)addr1[1].sa_family == (char)addr2[1].sa_family);
        auVar3[9] = -(*(char *)((long)&addr1[1].sa_family + 1) ==
                     *(char *)((long)&addr2[1].sa_family + 1));
        auVar3[10] = -(addr1[1].sa_data[0] == addr2[1].sa_data[0]);
        auVar3[0xb] = -(addr1[1].sa_data[1] == addr2[1].sa_data[1]);
        auVar3[0xc] = -(addr1[1].sa_data[2] == addr2[1].sa_data[2]);
        auVar3[0xd] = -(addr1[1].sa_data[3] == addr2[1].sa_data[3]);
        auVar3[0xe] = -(addr1[1].sa_data[4] == addr2[1].sa_data[4]);
        auVar3[0xf] = -(addr1[1].sa_data[5] == addr2[1].sa_data[5]);
        bVar2 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff;
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool net_compareAddress(const struct sockaddr* addr1, const struct sockaddr* addr2)
{
	if (addr1 == NULL || addr2 == NULL)
		return false;

	if (addr1 == addr2)
		return true;

	if (addr1->sa_family != addr2->sa_family)
	{
		return false;
	}

	if (addr1->sa_family == AF_INET6)
	{
		const struct sockaddr_in6* addr1_6 = (const struct sockaddr_in6*) addr1;
		const struct sockaddr_in6* addr2_6 = (const struct sockaddr_in6*) addr2;

		if (addr1_6->sin6_port != addr2_6->sin6_port)
		{
			return false;
		}

		return memcmp(&addr1_6->sin6_addr, &addr2_6->sin6_addr, sizeof(addr1_6->sin6_addr)) == 0;
	}
	else if (addr1->sa_family == AF_INET)
	{
		const struct sockaddr_in* addr_in_1 = (const struct sockaddr_in*) addr1;
		const struct sockaddr_in* addr_in_2 = (const struct sockaddr_in*) addr2;

		if (addr_in_1->sin_port != addr_in_2->sin_port)
		{
			return false;
		}

		return memcmp(&addr_in_1->sin_addr, &addr_in_2->sin_addr, sizeof(addr_in_1->sin_addr)) == 0;
	}
	else
	{
		return false;
		//return memcmp(addr1, addr2, sizeof(struct sockaddr)) == 0;
	}
}